

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall
aggreports::WheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  pointer pmVar4;
  _Rb_tree_color *p_Var5;
  iterator iVar6;
  pointer pfVar7;
  pointer pfVar8;
  long lVar9;
  undefined8 uVar10;
  undefined1 auVar11 [8];
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  mapped_type *pmVar14;
  code *pcVar15;
  vector<float,std::allocator<float>> *pvVar16;
  _Base_ptr p_Var17;
  bool *pbVar18;
  mapped_type_conflict2 *pmVar19;
  mapped_type *pmVar20;
  _Rb_tree_node_base *p_Var21;
  ulong uVar22;
  undefined4 in_register_0000000c;
  int *piVar23;
  int __tmp;
  _Rb_tree_node_base *p_Var24;
  long lVar25;
  aggreports *paVar26;
  _Rb_tree_color *p_Var27;
  float fVar28;
  vector<int,_std::allocator<int>_> fileIDs;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  maxCount;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  undefined1 local_148 [16];
  pointer local_138;
  int local_124;
  aggreports *local_120;
  undefined1 local_118 [8];
  _Rb_tree_node_base _Stack_110;
  size_t local_f0;
  vector<int,_std::allocator<int>_> *local_e0;
  pointer local_d8;
  int local_cc;
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_c8;
  ulong local_98;
  pointer local_90;
  _Base_ptr local_88;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_80;
  _Base_ptr local_78;
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_70;
  pointer local_40;
  pointer local_38;
  
  local_cc = eptype;
  local_e0 = handles;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_124 = eptype_tvar;
  local_120 = this;
  if ((int)fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start == 0) {
    local_98 = (ulong)(uint)this->samplesize_;
    pmVar4 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var21 = *(_Base_ptr *)((long)&pmVar4[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    p_Var24 = &pmVar4[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var21 != p_Var24) {
      do {
        _Var2 = p_Var21[1]._M_color;
        local_118 = *(undefined1 (*) [8])(p_Var21 + 1);
        iVar3 = *(int *)&p_Var21[1]._M_parent;
        _Stack_110._0_8_ = p_Var21[1]._M_parent;
        _Stack_110._M_parent =
             (_Base_ptr)CONCAT44(_Stack_110._M_parent._4_4_,*(undefined4 *)&p_Var21[1]._M_left);
        pcVar15 = (code *)GetOutLoss;
        if ((GetOutLoss & 1) != 0) {
          pcVar15 = *(code **)(*(long *)(&_Stack_110.field_0x4 +
                                        CONCAT44(in_register_0000000c,epcalc)) + -1 + GetOutLoss);
        }
        fVar28 = (float)(*pcVar15)(&_Stack_110.field_0x4 + CONCAT44(in_register_0000000c,epcalc));
        local_148._0_4_ = fVar28;
        local_c8._M_impl._4_4_ = iVar3;
        local_c8._M_impl._0_4_ = _Var2;
        pvVar16 = (vector<float,std::allocator<float>> *)
                  std::
                  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&local_70,(key_type *)&local_c8);
        iVar6._M_current = *(float **)(pvVar16 + 8);
        if (iVar6._M_current == *(float **)(pvVar16 + 0x10)) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (pvVar16,iVar6,(float *)local_148);
        }
        else {
          *iVar6._M_current = fVar28;
          *(float **)(pvVar16 + 8) = iVar6._M_current + 1;
        }
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
      } while (p_Var21 != p_Var24);
    }
  }
  else {
    local_80 = &this->ensembletosidx_;
    pmVar14 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](local_80,(key_type *)&fileIDs);
    local_98 = (ulong)((long)(pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
    pmVar4 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var17 = *(_Base_ptr *)((long)&pmVar4[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    local_88 = &pmVar4[1]._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var17 != local_88) {
      do {
        _Stack_110._M_parent =
             (_Base_ptr)CONCAT44(_Stack_110._M_parent._4_4_,*(undefined4 *)&p_Var17[1]._M_left);
        local_118 = *(undefined1 (*) [8])(p_Var17 + 1);
        _Stack_110._0_8_ = p_Var17[1]._M_parent;
        local_78 = p_Var17;
        pmVar14 = std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](local_80,(key_type *)&fileIDs);
        p_Var5 = (_Rb_tree_color *)
                 (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var27 = (_Rb_tree_color *)
                       (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; auVar11 = local_118, p_Var27 != p_Var5;
            p_Var27 = p_Var27 + 1) {
          _Var2 = *p_Var27;
          if (_Stack_110._M_color == _Var2) {
            pcVar15 = (code *)GetOutLoss;
            if ((GetOutLoss & 1) != 0) {
              pcVar15 = *(code **)(*(long *)(&_Stack_110.field_0x4 +
                                            CONCAT44(in_register_0000000c,epcalc)) + -1 + GetOutLoss
                                  );
            }
            fVar28 = (float)(*pcVar15)(&_Stack_110.field_0x4 + CONCAT44(in_register_0000000c,epcalc)
                                      );
            local_148._0_4_ = fVar28;
            local_c8._M_impl._4_4_ = _Var2;
            local_c8._M_impl._0_4_ = auVar11._0_4_;
            pvVar16 = (vector<float,std::allocator<float>> *)
                      std::
                      map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_70,(key_type *)&local_c8);
            iVar6._M_current = *(float **)(pvVar16 + 8);
            if (iVar6._M_current == *(float **)(pvVar16 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (pvVar16,iVar6,(float *)local_148);
            }
            else {
              *iVar6._M_current = fVar28;
              *(float **)(pvVar16 + 8) = iVar6._M_current + 1;
            }
          }
        }
        p_Var17 = (_Base_ptr)std::_Rb_tree_increment(local_78);
      } while (p_Var17 != local_88);
    }
  }
  paVar26 = local_120;
  pbVar18 = local_120->outputFlags_;
  piVar23 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = *piVar23;
  if (pbVar18[iVar3] == true) {
    if (local_120->ordFlag_ == true) {
      if (local_120->fout_[1] != (FILE *)0x0) {
        local_118 = (undefined1  [8])operator_new(4);
        *(int *)local_118 = 1;
        goto LAB_00108fe5;
      }
      local_118 = (undefined1  [8])0x0;
      _Stack_110._M_parent = (_Base_ptr)0x0;
    }
    else {
      local_118 = (undefined1  [8])operator_new(4);
      *(int *)local_118 = iVar3;
LAB_00108fe5:
      _Stack_110._M_parent = (_Base_ptr)((long)local_118 + 4);
    }
    _Stack_110._0_8_ = _Stack_110._M_parent;
    WritePerSampleExceedanceProbabilityTable
              (paVar26,(vector<int,_std::allocator<int>_> *)local_118,
               (map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&local_70,local_124,ensemble_id);
    if (local_118 != (undefined1  [8])0x0) {
      operator_delete((void *)local_118);
    }
    pbVar18 = paVar26->outputFlags_;
    piVar23 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pbVar18[piVar23[1]] == false) goto LAB_001093e1;
  _Stack_110._M_left = &_Stack_110;
  _Stack_110._0_8_ = _Stack_110._0_8_ & 0xffffffff00000000;
  _Stack_110._M_parent = (_Base_ptr)0x0;
  local_f0 = 0;
  _Stack_110._M_right = _Stack_110._M_left;
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_70._M_impl.super__Rb_tree_header) {
    p_Var17 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_c8._M_impl._0_4_ = p_Var17[1]._M_color;
      local_c8._M_impl._4_4_ = *(undefined4 *)&p_Var17[1].field_0x4;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_c8._M_impl.super__Rb_tree_header,
                 (vector<float,_std::allocator<float>_> *)&p_Var17[1]._M_parent);
      p_Var12 = local_c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar25 = CONCAT44(local_c8._M_impl.super__Rb_tree_header._M_header._4_4_,
                        local_c8._M_impl.super__Rb_tree_header._M_header._M_color);
      pmVar19 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_118,(key_type *)&local_c8);
      p_Var13 = local_c8._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (*pmVar19 < (ulong)((long)p_Var12 - lVar25 >> 2)) {
        lVar25 = CONCAT44(local_c8._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_c8._M_impl.super__Rb_tree_header._M_header._M_color);
        pmVar19 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)local_118,(key_type *)&local_c8);
        *pmVar19 = (long)p_Var13 - lVar25 >> 2;
      }
      if ((void *)CONCAT44(local_c8._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_c8._M_impl.super__Rb_tree_header._M_header._M_color) != (void *)0x0
         ) {
        operator_delete((void *)CONCAT44(local_c8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                         local_c8._M_impl.super__Rb_tree_header._M_header._M_color))
        ;
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != &local_70._M_impl.super__Rb_tree_header);
  }
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var21 = (local_120->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_120->summaryids_)._M_t._M_impl.super__Rb_tree_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var21 != p_Var1) {
    do {
      pmVar19 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_118,(key_type *)(p_Var21 + 1));
      local_d8 = (pointer)((ulong)local_d8 & 0xffffffff00000000);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_148,*pmVar19,
                 (value_type_conflict3 *)&local_d8,(allocator_type *)&local_90);
      pmVar20 = std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&local_c8,(key_type *)(p_Var21 + 1));
      pfVar7 = (pmVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (pmVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_148._0_8_;
      (pmVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_148._8_8_;
      (pmVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_138;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = (pointer)0x0;
      local_138 = (pointer)0x0;
      if ((pfVar7 != (pointer)0x0) &&
         (operator_delete(pfVar7), (pointer)local_148._0_8_ != (pointer)0x0)) {
        operator_delete((void *)local_148._0_8_);
      }
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var1);
  }
  paVar26 = local_120;
  if ((_Rb_tree_header *)local_70._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_70._M_impl.super__Rb_tree_header) {
    p_Var17 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_148._0_8_ = *(undefined8 *)(p_Var17 + 1);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)(local_148 + 8),
                 (vector<float,_std::allocator<float>_> *)&p_Var17[1]._M_parent);
      pfVar7 = local_138;
      uVar10 = local_148._8_8_;
      if ((long)local_138 - local_148._8_8_ != 0) {
        local_d8 = local_138;
        local_90 = (pointer)local_148._8_8_;
        uVar22 = (long)local_138 - local_148._8_8_ >> 2;
        lVar25 = 0x3f;
        if (uVar22 != 0) {
          for (; uVar22 >> lVar25 == 0; lVar25 = lVar25 + -1) {
          }
        }
        std::
        __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_d8,&local_90,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
        local_38 = pfVar7;
        local_40 = (pointer)uVar10;
        std::
        __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_38,&local_40);
      }
      pfVar7 = local_138;
      uVar10 = local_148._8_8_;
      if ((pointer)local_148._8_8_ != local_138) {
        lVar25 = 0;
        do {
          fVar28 = *(float *)(uVar10 + lVar25);
          pmVar20 = std::
                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)&local_c8,(key_type *)local_148);
          pfVar8 = (pmVar20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *(float *)((long)pfVar8 + lVar25) = fVar28 + *(float *)((long)pfVar8 + lVar25);
          lVar9 = lVar25 + 4;
          lVar25 = lVar25 + 4;
          paVar26 = local_120;
        } while ((pointer)(uVar10 + lVar9) != pfVar7);
      }
      if ((pointer)local_148._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_148._8_8_);
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != &local_70._M_impl.super__Rb_tree_header);
  }
  if (paVar26->ordFlag_ == true) {
    if (*paVar26->fout_ != (FILE *)0x0) {
      local_148._0_8_ = operator_new(4);
      *(float *)local_148._0_8_ = 0.0;
      goto LAB_00109379;
    }
    local_148._0_8_ = (pointer)0x0;
    local_138 = (pointer)0x0;
  }
  else {
    fVar28 = (float)(local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[1];
    local_148._0_8_ = operator_new(4);
    *(float *)local_148._0_8_ = fVar28;
LAB_00109379:
    local_138 = (pointer)(local_148._0_8_ + 4);
  }
  local_148._8_8_ = local_138;
  WriteExceedanceProbabilityTable
            (paVar26,(vector<int,_std::allocator<int>_> *)local_148,
             (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)&local_c8,(double)paVar26->totalperiods_,local_cc,local_124,ensemble_id,
             (int)local_98);
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
               *)local_118);
LAB_001093e1:
  std::
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_70);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMean(const std::vector<int> handles,
				OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				const int epcalc, const int eptype,
				const int eptype_tvar, int ensemble_id) {

  std::map<wheatkey, lossvec> items;
  int samplesize;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
    }
  }

  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
    WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype,
					     eptype_tvar);
  }

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  std::map<int, size_t> maxCount;
  for (auto x : items) {
    if (x.second.size() > maxCount[x.first.summary_id]) {
      maxCount[x.first.summary_id] = x.second.size();
    }
  }

  std::map<int, lossvec> mean_map;
  for (std::set<int>::iterator it = summaryids_.begin();
       it != summaryids_.end(); ++it) {
    mean_map[*it] = lossvec(maxCount[*it], 0);
  }

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    int i = 0;
    for (auto lp : lpv) {
      mean_map[s.first.summary_id][i] += lp;
      i++;
    }
  }

  std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar, samplesize);

}